

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_insert.cpp
# Opt level: O0

void __thiscall
duckdb::InsertGlobalState::InsertGlobalState
          (InsertGlobalState *this,ClientContext *context,
          vector<duckdb::LogicalType,_true> *return_types,DuckTableEntry *table)

{
  __buckets_ptr in_RCX;
  undefined8 in_RDX;
  vector<duckdb::LogicalType,_true> *in_RSI;
  ClientContext *in_RDI;
  ColumnDataCollection *unaff_retaddr;
  vector<duckdb::LogicalType,_true> *in_stack_ffffffffffffff98;
  ColumnDataAllocatorType type;
  ClientContext *context_00;
  
  type = (ColumnDataAllocatorType)((ulong)in_RDX >> 0x38);
  context_00 = in_RDI;
  GlobalSinkState::GlobalSinkState((GlobalSinkState *)in_RDI);
  (in_RDI->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
  super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&PTR__InsertGlobalState_0352f4e0;
  ::std::mutex::mutex((mutex *)0x186ddc3);
  (in_RDI->config).profiler_settings._M_h._M_buckets = in_RCX;
  (in_RDI->config).profiler_settings._M_h._M_bucket_count = 0;
  vector<duckdb::LogicalType,_true>::vector
            ((vector<duckdb::LogicalType,_true> *)in_RDI,in_stack_ffffffffffffff98);
  ColumnDataCollection::ColumnDataCollection(unaff_retaddr,context_00,in_RSI,type);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x186de27);
  return;
}

Assistant:

InsertGlobalState::InsertGlobalState(ClientContext &context, const vector<LogicalType> &return_types,
                                     DuckTableEntry &table)
    : table(table), insert_count(0), return_collection(context, return_types) {
}